

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O3

void * allocate(_Bool compress,zip_uint32_t compression_flags,zip_error_t *error)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)malloc(0x58);
  if (puVar2 != (undefined8 *)0x0) {
    *(zip_uint32_t *)((long)puVar2 + 0xc) = compression_flags;
    iVar1 = ZSTD_minCLevel();
    if (((int)compression_flags < iVar1) ||
       (iVar1 = ZSTD_maxCLevel(), iVar1 < (int)compression_flags)) {
      *(undefined4 *)((long)puVar2 + 0xc) = 0;
    }
    *puVar2 = error;
    *(_Bool *)(puVar2 + 1) = compress;
    *(undefined1 *)(puVar2 + 2) = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    return puVar2;
  }
  return (void *)0x0;
}

Assistant:

static void *
allocate(bool compress, zip_uint32_t compression_flags, zip_error_t *error) {
    struct ctx *ctx;

    if ((ctx = (struct ctx *)malloc(sizeof(*ctx))) == NULL) {
        zip_error_set(error, ZIP_ET_SYS, errno);
        return NULL;
    }

    ctx->error = error;
    ctx->compress = compress;
    if (compression_flags >= 1 && compression_flags <= 9) {
        ctx->level = (int)compression_flags;
    }
    else {
        ctx->level = Z_BEST_COMPRESSION;
    }
    ctx->mem_level = compression_flags == TORRENTZIP_COMPRESSION_FLAGS ? TORRENTZIP_MEM_LEVEL : MAX_MEM_LEVEL;
    ctx->end_of_input = false;

    ctx->zstr.zalloc = Z_NULL;
    ctx->zstr.zfree = Z_NULL;
    ctx->zstr.opaque = NULL;

    return ctx;
}